

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::recoverFromError(OurReader *this,TokenType skipUntilToken)

{
  bool bVar1;
  undefined1 local_38 [8];
  Token skip;
  size_t errorCount;
  TokenType skipUntilToken_local;
  OurReader *this_local;
  
  skip.end_ = (Location)
              std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::
              size(&this->errors_);
  do {
    bVar1 = readToken(this,(Token *)local_38);
    if (!bVar1) {
      std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
                (&this->errors_,(size_type)skip.end_);
    }
  } while ((local_38._0_4_ != skipUntilToken) && (local_38._0_4_ != tokenEndOfStream));
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
            (&this->errors_,(size_type)skip.end_);
  return false;
}

Assistant:

bool OurReader::recoverFromError(TokenType skipUntilToken) {
  size_t errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}